

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

string * __thiscall FIX::FieldMap::calculateString(FieldMap *this,string *result)

{
  bool bVar1;
  pointer pFVar2;
  string *psVar3;
  size_type sVar4;
  pointer ppVar5;
  reference ppFVar6;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_60;
  FieldMap **local_58;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_50;
  const_iterator k;
  int local_3c;
  _Self local_38;
  const_iterator j;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_20;
  const_iterator i;
  string *result_local;
  FieldMap *this_local;
  
  i._M_current = (FieldBase *)result;
  __gnu_cxx::
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  ::__normal_iterator(&local_20);
  local_20._M_current =
       (FieldBase *)
       std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::begin(&this->m_fields);
  while( true ) {
    j._M_node = (_Base_ptr)
                std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
                        *)&j);
    if (!bVar1) break;
    pFVar2 = __gnu_cxx::
             __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
             ::operator->(&local_20);
    psVar3 = FieldBase::getFixString_abi_cxx11_(pFVar2);
    std::__cxx11::string::operator+=((string *)i._M_current,(string *)psVar3);
    sVar4 = std::
            map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
            ::size(&this->m_groups);
    if (sVar4 != 0) {
      pFVar2 = __gnu_cxx::
               __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
               ::operator->(&local_20);
      local_3c = FieldBase::getTag(pFVar2);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
           ::find(&this->m_groups,&local_3c);
      k._M_current = (FieldMap **)
                     std::
                     map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
                     ::end(&this->m_groups);
      bVar1 = std::operator==(&local_38,(_Self *)&k);
      if (!bVar1) {
        __gnu_cxx::
        __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
        ::__normal_iterator(&local_50);
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                 ::operator->(&local_38);
        local_58 = (FieldMap **)
                   std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin
                             (&ppVar5->second);
        local_50._M_current = local_58;
        while( true ) {
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                   ::operator->(&local_38);
          local_60._M_current =
               (FieldMap **)
               std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end(&ppVar5->second);
          bVar1 = __gnu_cxx::operator!=(&local_50,&local_60);
          if (!bVar1) break;
          ppFVar6 = __gnu_cxx::
                    __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                    ::operator*(&local_50);
          calculateString(*ppFVar6,(string *)i._M_current);
          __gnu_cxx::
          __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
          ::operator++(&local_50);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
    ::operator++(&local_20);
  }
  return (string *)i._M_current;
}

Assistant:

std::string& FieldMap::calculateString( std::string& result ) const
{  
  Fields::const_iterator i;
  for ( i = m_fields.begin(); i != m_fields.end(); ++i )
  {
    result += i->getFixString();

    // add groups if they exist
    if( !m_groups.size() ) continue;
    Groups::const_iterator j = m_groups.find( i->getTag() );
    if ( j == m_groups.end() ) continue;
    std::vector < FieldMap* > ::const_iterator k;
    for ( k = j->second.begin(); k != j->second.end(); ++k )
      ( *k ) ->calculateString( result );
  }
  return result;
}